

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O1

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  type_conflict val;
  EColorRange local_24;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = ::Serialize(arc,"left",&this->Left,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"top",&this->Top,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"centerx",&this->CenterX,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"holdtics",&this->HoldTics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"tics",&this->Tics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"state",&this->State,(int32_t *)0x0);
  local_24 = this->TextColor;
  ::Serialize(pFVar1,"textcolor",&local_24,(int32_t *)0x0);
  this->TextColor = local_24;
  pFVar1 = ::Serialize(pFVar1,"sbarid",&this->SBarID,(uint32_t *)0x0);
  pFVar1 = Serialize<char>(pFVar1,"sourcetext",&this->SourceText,(char **)0x0);
  pFVar1 = Serialize<FFont>(pFVar1,"font",&this->Font,(FFont **)0x0);
  ::Serialize(pFVar1,"next",(DObject **)&this->Next,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"hudwidth",&this->HUDWidth,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"hudheight",&this->HUDHeight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"nowrap",&this->NoWrap,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"clipx",&this->ClipX,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"clipy",&this->ClipY,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"clipwidth",&this->ClipWidth,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"clipheight",&this->ClipHeight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"wrapwidth",&this->WrapWidth,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"handleaspect",&this->HandleAspect,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"visibilityflags",&this->VisibilityFlags,(int32_t *)0x0);
  pFVar1 = FSerializer::Array<unsigned_char>
                     (pFVar1,"style",(uchar *)&(this->Style).AsDWORD,(uchar *)0x0,4,false);
  ::Serialize(pFVar1,"alpha",&this->Alpha,(double *)0x0);
  if (arc->r != (FReader *)0x0) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("left", Left)
		("top", Top)
		("centerx", CenterX)
		("holdtics", HoldTics)
		("tics", Tics)
		("state", State)
		.Enum("textcolor", TextColor)
		("sbarid", SBarID)
		("sourcetext", SourceText)
		("font", Font)
		("next", Next)
		("hudwidth", HUDWidth)
		("hudheight", HUDHeight)
		("nowrap", NoWrap)
		("clipx", ClipX)
		("clipy", ClipY)
		("clipwidth", ClipWidth)
		("clipheight", ClipHeight)
		("wrapwidth", WrapWidth)
		("handleaspect", HandleAspect)
		("visibilityflags", VisibilityFlags)
		("style", Style)
		("alpha", Alpha);

	if (arc.isReading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}